

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O0

int RSA_decrypt(RSA *rsa,size_t *out_len,uint8_t *out,size_t max_out,uint8_t *in,size_t in_len,
               int padding)

{
  size_t in_len_local;
  uint8_t *in_local;
  size_t max_out_local;
  uint8_t *out_local;
  size_t *out_len_local;
  RSA *rsa_local;
  
  if (rsa->meth->decrypt ==
      (_func_int_RSA_ptr_size_t_ptr_uint8_t_ptr_size_t_uint8_t_ptr_size_t_int *)0x0) {
    rsa_local._4_4_ = rsa_default_decrypt(rsa,out_len,out,max_out,in,in_len,padding);
  }
  else {
    rsa_local._4_4_ = (*rsa->meth->decrypt)(rsa,out_len,out,max_out,in,in_len,padding);
  }
  return rsa_local._4_4_;
}

Assistant:

int RSA_decrypt(RSA *rsa, size_t *out_len, uint8_t *out, size_t max_out,
                const uint8_t *in, size_t in_len, int padding) {
  if (rsa->meth->decrypt) {
    return rsa->meth->decrypt(rsa, out_len, out, max_out, in, in_len, padding);
  }

  return rsa_default_decrypt(rsa, out_len, out, max_out, in, in_len, padding);
}